

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read.c
# Opt level: O2

void test_archive_read_ahead_eof(void)

{
  int iVar1;
  archive_read *a;
  void *pvVar2;
  ssize_t avail;
  
  a = (archive_read *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'(',(uint)(a != (archive_read *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_raw((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'+',(uint)(iVar1 == 0),"0 == archive_read_support_format_raw(a)",a);
  iVar1 = archive_read_open_memory((archive *)a,buf,0x400);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L',',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buf, sizeof(buf))",a);
  pvVar2 = __archive_read_ahead(a,0x3ff,&avail);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'/',(uint)(pvVar2 != (void *)0x0),
                   "NULL != __archive_read_ahead(ar, sizeof(buf) - 1, &avail)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                      ,L'0',0x400,"sizeof(buf)",avail,"avail",(void *)0x0);
  pvVar2 = __archive_read_ahead(a,0x401,&avail);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'3',(uint)(pvVar2 == (void *)0x0),
                   "NULL == __archive_read_ahead(ar, sizeof(buf) + 1, &avail)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                      ,L'4',0x400,"sizeof(buf)",avail,"avail",(void *)0x0);
  pvVar2 = __archive_read_ahead(a,0x401,&avail);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'7',(uint)(pvVar2 == (void *)0x0),
                   "NULL == __archive_read_ahead(ar, sizeof(buf) + 1, &avail)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                      ,L'8',0x400,"sizeof(buf)",avail,"avail",(void *)0x0);
  pvVar2 = __archive_read_ahead(a,0x400,&avail);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L';',(uint)(pvVar2 != (void *)0x0),
                   "NULL != __archive_read_ahead(ar, sizeof(buf), &avail)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                      ,L'<',0x400,"sizeof(buf)",avail,"avail",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_ahead_eof)
{
	struct archive *a;
	struct archive_read *ar;
	ssize_t avail;

	/* prepare a reader of raw in-memory data */
	assert((a = archive_read_new()) != NULL);
	ar = (struct archive_read *)a;

	assertA(0 == archive_read_support_format_raw(a));
	assertA(0 == archive_read_open_memory(a, buf, sizeof(buf)));

	/* perform a read which can be fulfilled */
	assert(NULL != __archive_read_ahead(ar, sizeof(buf) - 1, &avail));
	assertEqualInt(sizeof(buf), avail);

	/* perform a read which cannot be fulfilled due to EOF */
	assert(NULL == __archive_read_ahead(ar, sizeof(buf) + 1, &avail));
	assertEqualInt(sizeof(buf), avail);

	/* perform the same read again */
	assert(NULL == __archive_read_ahead(ar, sizeof(buf) + 1, &avail));
	assertEqualInt(sizeof(buf), avail);

	/* perform another read which can be fulfilled */
	assert(NULL != __archive_read_ahead(ar, sizeof(buf), &avail));
	assertEqualInt(sizeof(buf), avail);

	assert(0 == archive_read_free(a));
}